

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O2

FloatSampleProvider *
SRCTools::ResamplerModel::createResamplerModel
          (FloatSampleProvider *source,ResamplerStage **resamplerStages,uint stageCount)

{
  ResamplerStage *pRVar1;
  FloatSampleProvider *pFVar2;
  ulong uVar3;
  
  for (uVar3 = 0; stageCount != uVar3; uVar3 = uVar3 + 1) {
    pFVar2 = (FloatSampleProvider *)operator_new(0x8028);
    pRVar1 = resamplerStages[uVar3];
    pFVar2->_vptr_FloatSampleProvider = (_func_int **)&PTR__FloatSampleProvider_00133af8;
    pFVar2[1]._vptr_FloatSampleProvider = (_func_int **)pRVar1;
    pFVar2[2]._vptr_FloatSampleProvider = (_func_int **)source;
    pFVar2[0x1003]._vptr_FloatSampleProvider = (_func_int **)(pFVar2 + 3);
    *(undefined4 *)&pFVar2[0x1004]._vptr_FloatSampleProvider = 0;
    source = pFVar2;
  }
  return source;
}

Assistant:

FloatSampleProvider &ResamplerModel::createResamplerModel(FloatSampleProvider &source, ResamplerStage **resamplerStages, unsigned int stageCount) {
	FloatSampleProvider *prevStage = &source;
	for (unsigned int i = 0; i < stageCount; i++) {
		prevStage = new CascadeStage(*prevStage, *(resamplerStages[i]));
	}
	return *prevStage;
}